

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malicious_aligned_heap_vectorization.cpp
# Opt level: O0

int main(void)

{
  Vector4d *this;
  Vector4d *this_00;
  Point *this_01;
  Point *this_02;
  ostream *poVar1;
  void *pvVar2;
  size_t in_RSI;
  code *ptr;
  undefined1 local_a8 [8];
  Vector4d result;
  Point *point2;
  Point *point1;
  Vector4d *input2;
  Vector4d *input1;
  
  this = (Vector4d *)Vector4d::operator_new((Vector4d *)0x20,in_RSI);
  Vector4d::Vector4d(this,1.0,1.0,1.0,1.0);
  this_00 = (Vector4d *)Vector4d::operator_new((Vector4d *)0x20,in_RSI);
  Vector4d::Vector4d(this_00,1.0,2.0,3.0,4.0);
  this_01 = (Point *)operator_new(0x20);
  Point::Point(this_01,(Vector4d)*&this->data);
  this_02 = (Point *)operator_new(0x20);
  result.data[3] = this_00->data[0];
  Point::Point(this_02,(Vector4d)*&this_00->data);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of point1: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this_01);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"address of point2: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this_02);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  operator+((Vector4d *)result.data[3],(Vector4d *)result.data[2]);
  poVar1 = operator<<((ostream *)&std::cout,(Vector4d *)local_a8);
  ptr = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (this != (Vector4d *)0x0) {
    Vector4d::operator_delete(this,ptr);
  }
  if (this_00 != (Vector4d *)0x0) {
    Vector4d::operator_delete(this_00,ptr);
  }
  if (this_01 != (Point *)0x0) {
    operator_delete(this_01);
  }
  if (this_02 != (Point *)0x0) {
    operator_delete(this_02);
  }
  return 0;
}

Assistant:

int main() {
  Vector4d* input1 = new Vector4d{1, 1, 1, 1};
  Vector4d* input2 = new Vector4d{1, 2, 3, 4};

  Point* point1 = new Point{*input1};
  Point* point2 = new Point{*input2};

  std::cout << "address of point1: " << point1->position.data << std::endl;
  std::cout << "address of point2: " << point2->position.data << std::endl;

  Vector4d result = point1->position + point2->position;

  std::cout << result << std::endl;

  delete input1;
  delete input2;
  delete point1;
  delete point2;
  return 0;
}